

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void cs::foreach_helper<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,cs_impl::any>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  element_type *peVar1;
  _Elt_pointer ppsVar2;
  statement_base *psVar3;
  bool bVar4;
  undefined *puVar5;
  var *pvVar6;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar7;
  _Elt_pointer val;
  _Map_pointer pppsVar8;
  _Elt_pointer ppsVar9;
  int iVar10;
  _Elt_pointer ppsVar11;
  scope_guard scope;
  scope_guard local_c8;
  _Map_pointer local_c0;
  _Elt_pointer local_b8;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *local_b0;
  _Elt_pointer local_a8;
  string *local_a0;
  var *local_98;
  
  local_a0 = iterator;
  pdVar7 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(obj);
  if ((pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1->break_block == true) {
      peVar1->break_block = false;
    }
    if (peVar1->continue_block == true) {
      peVar1->continue_block = false;
    }
    local_c8.context = context;
    domain_manager::add_domain(&(peVar1->super_runtime_type).storage);
    pdVar7 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(obj);
    val = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
          super__Deque_impl_data._M_start._M_cur;
    local_a8 = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    if (val != local_a8) {
      local_b8 = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_last;
      local_c0 = (pdVar7->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_node;
      local_b0 = body;
      do {
        puVar5 = current_process;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar5 + 0xd0),(void *)0x0);
        }
        domain_manager::add_var_no_return<std::__cxx11::string_const&>
                  (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->instance).
                      super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_runtime_type).storage,local_a0,val);
        ppsVar11 = (body->
                   super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_start._M_cur;
        ppsVar2 = (body->
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_98 = val;
        if (ppsVar11 != ppsVar2) {
          ppsVar9 = (body->
                    super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                    _M_impl.super__Deque_impl_data._M_start._M_last;
          pppsVar8 = (body->
                     super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
          do {
            puVar5 = current_process;
            psVar3 = *ppsVar11;
            if ((*current_process & 1) != 0) {
              LOCK();
              *current_process = 0;
              UNLOCK();
              event_type::touch((event_type *)(puVar5 + 0xd0),(void *)0x0);
            }
            (*psVar3->_vptr_statement_base[3])(psVar3);
            peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->instance).
                     super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar10 = 1;
            if (peVar1->return_fcall == false) {
              if (peVar1->break_block == true) {
                peVar1->break_block = false;
                goto LAB_002ba2bb;
              }
              if (peVar1->continue_block == true) {
                peVar1->continue_block = false;
                iVar10 = 4;
                goto LAB_002ba2bb;
              }
              iVar10 = 0;
              bVar4 = true;
            }
            else {
LAB_002ba2bb:
              bVar4 = false;
            }
            if (!bVar4) goto LAB_002ba2f1;
            ppsVar11 = ppsVar11 + 1;
            if (ppsVar11 == ppsVar9) {
              ppsVar11 = pppsVar8[1];
              pppsVar8 = pppsVar8 + 1;
              ppsVar9 = ppsVar11 + 0x40;
            }
          } while (ppsVar11 != ppsVar2);
        }
        iVar10 = 4;
LAB_002ba2f1:
        pvVar6 = local_98;
        body = local_b0;
        if (iVar10 == 4) {
          iVar10 = 0;
          domain_manager::next_domain
                    (&((((((local_c8.context)->
                          super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                        ->instance).
                        super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_runtime_type).storage);
        }
        if (iVar10 != 0) break;
        val = pvVar6 + 1;
        if (val == local_b8) {
          val = local_c0[1];
          local_c0 = local_c0 + 1;
          local_b8 = val + 0x40;
        }
      } while (val != local_a8);
    }
    scope_guard::~scope_guard(&local_c8);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}